

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int parse_asn1_tag(CBS *cbs,CBS_ASN1_TAG *out)

{
  int iVar1;
  ulong local_38;
  uint64_t v;
  uint local_28;
  CBS_ASN1_TAG tag_number;
  CBS_ASN1_TAG tag;
  uint8_t tag_byte;
  CBS_ASN1_TAG *out_local;
  CBS *cbs_local;
  
  _tag = out;
  out_local = (CBS_ASN1_TAG *)cbs;
  iVar1 = CBS_get_u8(cbs,(uint8_t *)((long)&tag_number + 3));
  if (iVar1 == 0) {
    cbs_local._4_4_ = 0;
  }
  else {
    local_28 = (tag_number._3_1_ & 0xe0) << 0x18;
    v._4_4_ = tag_number._3_1_ & 0x1f;
    if (v._4_4_ == 0x1f) {
      iVar1 = parse_base128_integer((CBS *)out_local,&local_38);
      if (((iVar1 == 0) || (0x1fffffff < local_38)) || (local_38 < 0x1f)) {
        return 0;
      }
      v._4_4_ = (uint)local_38;
    }
    if (((v._4_4_ | local_28) & 0xdfffffff) == 0) {
      cbs_local._4_4_ = 0;
    }
    else {
      *_tag = v._4_4_ | local_28;
      cbs_local._4_4_ = 1;
    }
  }
  return cbs_local._4_4_;
}

Assistant:

static int parse_asn1_tag(CBS *cbs, CBS_ASN1_TAG *out) {
  uint8_t tag_byte;
  if (!CBS_get_u8(cbs, &tag_byte)) {
    return 0;
  }

  // ITU-T X.690 section 8.1.2.3 specifies the format for identifiers with a tag
  // number no greater than 30.
  //
  // If the number portion is 31 (0x1f, the largest value that fits in the
  // allotted bits), then the tag is more than one byte long and the
  // continuation bytes contain the tag number.
  CBS_ASN1_TAG tag = ((CBS_ASN1_TAG)tag_byte & 0xe0) << CBS_ASN1_TAG_SHIFT;
  CBS_ASN1_TAG tag_number = tag_byte & 0x1f;
  if (tag_number == 0x1f) {
    uint64_t v;
    if (!parse_base128_integer(cbs, &v) ||
        // Check the tag number is within our supported bounds.
        v > CBS_ASN1_TAG_NUMBER_MASK ||
        // Small tag numbers should have used low tag number form, even in BER.
        v < 0x1f) {
      return 0;
    }
    tag_number = (CBS_ASN1_TAG)v;
  }

  tag |= tag_number;

  // Tag [UNIVERSAL 0] is reserved for use by the encoding. Reject it here to
  // avoid some ambiguity around ANY values and BER indefinite-length EOCs. See
  // https://crbug.com/boringssl/455.
  if ((tag & ~CBS_ASN1_CONSTRUCTED) == 0) {
    return 0;
  }

  *out = tag;
  return 1;
}